

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O1

dgEdge * __thiscall dgPolyhedra::AddHalfEdge(dgPolyhedra *this,HaI32 v0,HaI32 v1)

{
  dgTreeNode *pdVar1;
  dgEdge *pdVar2;
  dgTreeNode *pdVar3;
  bool foundState;
  bool local_39;
  dgEdge local_38;
  
  if (v0 == v1) {
    return (dgEdge *)0x0;
  }
  local_38.m_incidentFace = -1;
  local_38.m_userData = 0;
  local_38.m_next = (dgEdge *)0x0;
  local_38.m_prev = (dgEdge *)0x0;
  local_38.m_twin = (dgEdge *)0x0;
  local_38.m_mark = 0;
  local_38.m_incidentVertex = v0;
  pdVar1 = dgTree<dgEdge,_long>::Insert
                     (&this->super_dgTree<dgEdge,_long>,&local_38,(long)v1 | (ulong)(uint)v0 << 0x20
                      ,&local_39);
  pdVar3 = (dgTreeNode *)0x0;
  if (local_39 == false) {
    pdVar3 = pdVar1;
  }
  pdVar2 = &pdVar3->m_info;
  if (pdVar3 == (dgTreeNode *)0x0) {
    pdVar2 = (dgEdge *)0x0;
  }
  return pdVar2;
}

Assistant:

dgEdge* dgPolyhedra::AddHalfEdge (hacd::HaI32 v0, hacd::HaI32 v1)
{
	if (v0 != v1) {
		dgPairKey pairKey (v0, v1);
		dgEdge tmpEdge (v0, -1);

		dgTreeNode* node = Insert (tmpEdge, pairKey.GetVal()); 
		return node ? &node->GetInfo() : NULL;
	} else {
		return NULL;
	}
}